

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::multiply_conv(bool add_to,tensor *dest,tensor *src1,tensor *src2)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar10;
  fatal_error *pfVar11;
  long lVar12;
  void *__s;
  long lVar13;
  long k;
  long lVar14;
  long r;
  long lVar15;
  long lVar16;
  long c;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [64];
  ostringstream dlib_o_out;
  string local_1c8;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  iVar9 = (*dest->_vptr_tensor[3])(dest);
  __s = (void *)CONCAT44(extraout_var,iVar9);
  iVar9 = (*src1->_vptr_tensor[2])(src1);
  lVar18 = CONCAT44(extraout_var_00,iVar9);
  iVar9 = (*src2->_vptr_tensor[2])();
  lVar19 = CONCAT44(extraout_var_01,iVar9);
  lVar2 = dest->m_n;
  lVar13 = src1->m_n;
  if ((((lVar2 == lVar13) && (lVar3 = dest->m_k, lVar3 == src1->m_k)) &&
      (lVar12 = dest->m_nr, lVar12 == src1->m_nr)) && (dest->m_nc == src1->m_nc)) {
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x1010101));
    auVar5 = vpinsrq_avx(auVar6._0_16_,lVar3,1);
    auVar7 = vpblendd_avx2(auVar6,ZEXT1632(auVar5),0xf);
    auVar6._0_8_ = src2->m_n;
    auVar6._8_8_ = src2->m_k;
    auVar6._16_8_ = src2->m_nr;
    auVar6._24_8_ = src2->m_nc;
    uVar8 = vpcmpeqq_avx512vl(auVar7,auVar6);
    if (((byte)uVar8 & 0xf) != 0xf) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)",
                 0x4d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "src2.num_samples() == 1 && src2.nr() == 1 && src2.nc() == 1 && src2.k() == src1.k()"
                 ,0x53);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_1c8);
      __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
    }
    if (add_to) {
      if (0 < lVar2) {
        lVar13 = 0;
        do {
          if (0 < lVar3) {
            lVar14 = 0;
            lVar4 = dest->m_nc;
            do {
              if (0 < lVar12) {
                lVar15 = 0;
                do {
                  if (0 < lVar4) {
                    lVar16 = 0;
                    lVar17 = 0;
                    do {
                      lVar16 = lVar16 + -4;
                      auVar5 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar19 + lVar14 * 4)),
                                               ZEXT416(*(uint *)(lVar18 + lVar17 * 4)),
                                               ZEXT416(*(uint *)((long)__s + lVar17 * 4)));
                      *(int *)((long)__s + lVar17 * 4) = auVar5._0_4_;
                      lVar17 = lVar17 + 1;
                    } while (lVar4 != lVar17);
                    lVar18 = lVar18 - lVar16;
                    __s = (void *)((long)__s - lVar16);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != lVar12);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != lVar3);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar2);
      }
    }
    else if (0 < lVar2) {
      lVar13 = 0;
      do {
        if (0 < lVar3) {
          lVar14 = 0;
          lVar4 = dest->m_nc;
          do {
            if (0 < lVar12) {
              lVar15 = 0;
              do {
                if (0 < lVar4) {
                  lVar16 = 0;
                  lVar17 = 0;
                  do {
                    lVar16 = lVar16 + -4;
                    *(float *)((long)__s + lVar17 * 4) =
                         *(float *)(lVar18 + lVar17 * 4) * *(float *)(lVar19 + lVar14 * 4);
                    lVar17 = lVar17 + 1;
                  } while (lVar4 != lVar17);
                  lVar18 = lVar18 - lVar16;
                  __s = (void *)((long)__s - lVar16);
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 != lVar12);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar3);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar2);
    }
  }
  else {
    if (((lVar13 != src2->m_n) || (lVar3 = src1->m_k, lVar3 != src2->m_k)) ||
       ((src1->m_nr != src2->m_nr || (src1->m_nc != src2->m_nc)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x83);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)",
                 0x4d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"have_same_dimensions(src1,src2)",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_1c8);
      __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
    }
    if (((lVar2 != 1) || (dest->m_nr != 1)) || ((dest->m_nc != 1 || (dest->m_k != lVar3)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x84);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)",
                 0x4d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "dest.num_samples() == 1 && dest.nr() == 1 && dest.nc() == 1 && dest.k() == src1.k()"
                 ,0x53);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_1c8);
      __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
    }
    if (0 < lVar3 && !add_to) {
      memset(__s,0,lVar3 * 4);
    }
    if (0 < lVar13) {
      lVar2 = src1->m_nr;
      lVar12 = 0;
      do {
        if (0 < lVar3) {
          lVar4 = src1->m_nc;
          lVar14 = 0;
          do {
            if (0 < lVar2) {
              lVar15 = 0;
              do {
                if (0 < lVar4) {
                  auVar20 = ZEXT464(*(uint *)((long)__s + lVar14 * 4));
                  lVar16 = 0;
                  lVar17 = 0;
                  do {
                    lVar16 = lVar16 + -4;
                    auVar5 = vfmadd231ss_fma(auVar20._0_16_,ZEXT416(*(uint *)(lVar18 + lVar17 * 4)),
                                             ZEXT416(*(uint *)(lVar19 + lVar17 * 4)));
                    auVar20 = ZEXT1664(auVar5);
                    lVar17 = lVar17 + 1;
                    *(int *)((long)__s + lVar14 * 4) = auVar5._0_4_;
                  } while (lVar4 != lVar17);
                  lVar19 = lVar19 - lVar16;
                  lVar18 = lVar18 - lVar16;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 != lVar2);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar3);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar13);
    }
  }
  return;
}

Assistant:

void multiply_conv (
            bool add_to,
            tensor& dest,
            const tensor& src1,
            const tensor& src2
        )
        {
            auto d = dest.host();
            auto s1 = src1.host();
            auto s2 = src2.host();
            if (have_same_dimensions(dest,src1))
            {
                DLIB_CASSERT(src2.num_samples() == 1 && src2.nr() == 1 && src2.nc() == 1 && src2.k() == src1.k());

                if (add_to)
                {
                    for (long n = 0; n < dest.num_samples(); ++n)
                    {
                        for (long k = 0; k < dest.k(); ++k)
                        {
                            for (long r = 0; r < dest.nr(); ++r)
                            {
                                for (long c = 0; c < dest.nc(); ++c)
                                {
                                    *d++ += (*s1++)*s2[k];
                                }
                            }
                        }
                    }
                }
                else
                {
                    for (long n = 0; n < dest.num_samples(); ++n)
                    {
                        for (long k = 0; k < dest.k(); ++k)
                        {
                            for (long r = 0; r < dest.nr(); ++r)
                            {
                                for (long c = 0; c < dest.nc(); ++c)
                                {
                                    *d++ = (*s1++)*s2[k];
                                }
                            }
                        }
                    }
                }
            }
            else
            {
                DLIB_CASSERT(have_same_dimensions(src1,src2));
                DLIB_CASSERT(dest.num_samples() == 1 && dest.nr() == 1 && dest.nc() == 1 && dest.k() == src1.k());

                if (!add_to)
                {
                    for (long k = 0; k < src1.k(); ++k)
                        d[k] = 0;
                }

                for (long n = 0; n < src1.num_samples(); ++n)
                {
                    for (long k = 0; k < src1.k(); ++k)
                    {
                        for (long r = 0; r < src1.nr(); ++r)
                        {
                            for (long c = 0; c < src1.nc(); ++c)
                            {
                                d[k] += (*s1++)*(*s2++);
                            }
                        }
                    }
                }
            }
        }